

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readskel.c
# Opt level: O2

void read_skel(char *name)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  FILE *__stream;
  char *pcVar5;
  size_t sVar6;
  long lVar7;
  char **ppcVar8;
  ushort **ppuVar9;
  long lVar10;
  char *pcVar11;
  char cVar12;
  section *psVar13;
  char *cptr;
  uint uVar14;
  uint uVar15;
  char buf [256];
  
  __stream = fopen(name,"r");
  if (__stream == (FILE *)0x0) {
    open_error(name);
  }
  uVar14 = 0xfffffffe;
  uVar15 = 0;
  bVar2 = true;
LAB_00116d98:
  do {
    while( true ) {
      do {
        pcVar5 = fgets(buf,0xff,__stream);
        if (pcVar5 == (char *)0x0) {
          if ((int)uVar14 < 0) {
            if (uVar14 == 0xfffffffe) {
              error(0,(char *)0x0,(char *)0x0,"No sections found in skeleton file \"%s\"",name);
            }
          }
          else {
            ppcVar8 = fin_section();
            section_list[uVar14].ptr = ppcVar8;
          }
          return;
        }
        uVar15 = uVar15 + bVar2;
        sVar6 = strlen(buf);
      } while ((int)sVar6 == 0);
      lVar7 = sVar6 << 0x20;
      lVar10 = lVar7 + -0x100000000 >> 0x20;
      cVar12 = buf[lVar10];
      if (cVar12 != '\n') {
        buf[lVar7 >> 0x20] = '\\';
        lVar10 = lVar7 + 0x100000000 >> 0x20;
      }
      bVar1 = cVar12 == '\n';
      buf[lVar10] = '\0';
      if (((bVar2) && (buf[0] == '%')) && (buf[1] == '%')) break;
      bVar2 = bVar1;
      if (-1 < (int)uVar14) {
        add_string(buf);
      }
    }
    if (-1 < (int)uVar14) {
      ppcVar8 = fin_section();
      section_list[uVar14].ptr = ppcVar8;
    }
    ppuVar9 = __ctype_b_loc();
    pcVar5 = buf + 3;
    cptr = buf + 2;
    while( true ) {
      cVar12 = *cptr;
      lVar10 = (long)cVar12;
      if (lVar10 == 0) break;
      if ((*(byte *)((long)*ppuVar9 + lVar10 * 2 + 1) & 0x20) == 0) goto LAB_00116e8a;
      cptr = cptr + 1;
      pcVar5 = pcVar5 + 1;
    }
    lVar10 = 0;
LAB_00116e8a:
    uVar14 = 0xffffffff;
    if ((*(byte *)((long)*ppuVar9 + lVar10 * 2 + 1) & 4) == 0) {
LAB_00116f0a:
      bVar2 = bVar1;
      if (cVar12 != '\0') {
        error(0,buf,cptr,"line %d of \"%s\", bad section name",(ulong)uVar15,name);
      }
      goto LAB_00116d98;
    }
    do {
      pcVar11 = pcVar5;
      pcVar5 = pcVar11 + 1;
    } while (((*ppuVar9)[*pcVar11] & 8) != 0);
    *pcVar11 = '\0';
    uVar4 = 0;
    uVar14 = 0xffffffff;
    for (psVar13 = section_list; psVar13->name != (char *)0x0; psVar13 = psVar13 + 1) {
      iVar3 = strcmp(psVar13->name,cptr);
      if (iVar3 == 0) {
        uVar14 = uVar4;
      }
      uVar4 = uVar4 + 1;
    }
    if ((int)uVar14 < 0) {
      cVar12 = *cptr;
      goto LAB_00116f0a;
    }
    add_fmt((char *)0x0,(ulong)(uVar15 + 1),name);
    bVar2 = bVar1;
  } while( true );
}

Assistant:

void read_skel(char *name)
{
char	buf[256];
int	section = -2;
int	line = 0, sline = 1, eline = 1;
int	i;
FILE	*fp;

    if (!(fp = fopen(name, "r")))
	open_error(name);
    while(fgets(buf, 255, fp)) {
	if ((sline = eline))
	    line++;
	if ((i = strlen(buf)) == 0)
	    continue;
	if (buf[i-1] == '\n') {
	    buf[--i] = 0;
	    eline = 1;
	} else {
	    buf[i++] = '\\';
	    buf[i] = 0;
	    eline = 0;
	}
	if (sline && buf[0] == '%' && buf[1] == '%') {
	    char *p = buf+2;
	    if (section >= 0) {
	      section_list[section].ptr = fin_section();
	    }
	    section = -1;
	    while(*p && isspace(*p)) p++;
	    if (isalpha(*p)) {
	      char *e = p;
	      while(isalnum(*++e));
	      *e = 0;
	      for (i=0; section_list[i].name; i++)
		if (!strcmp(section_list[i].name, p))
		  section = i;
	    }
	    if (section >= 0)
	      add_fmt("#line %d \"%s\"", line+1, name);
	    else if (*p)
	      error(0, buf, p, "line %d of \"%s\", bad section name",
		    line, name);
        } else if (section >= 0) {
	    add_string(buf);
	}
    }
    if (section >= 0)
	section_list[section].ptr = fin_section();
    if (section == -2)
	error(0, 0, 0, "No sections found in skeleton file \"%s\"", name);
}